

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O3

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
::tbbRadixIteration(ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
                    *this,uint shift,bool last,KeyValue *src,KeyValue *dst,size_t numTasks)

{
  size_t last_00;
  char cVar1;
  runtime_error *prVar2;
  affinity_partitioner ap;
  task_group_context context;
  affinity_partitioner_base local_118;
  anon_class_40_5_1ab32771 local_100;
  size_t local_d8;
  anon_class_8_1_898bcfc2_conflict3 local_d0;
  uint local_c4;
  KeyValue *local_c0;
  KeyValue *local_b8;
  task_group_context local_b0;
  
  local_118.my_array = (slot_id *)0x0;
  local_118.my_size = 0;
  local_b0.my_version = proxy_support;
  local_b0.my_traits = (context_traits)0x4;
  local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b0.my_name = CUSTOM_CTX;
  local_100.this = this;
  local_100.shift = &local_c4;
  local_100.src = &local_b8;
  local_100.dst = &local_c0;
  local_100.numTasks = &local_d8;
  local_d8 = numTasks;
  local_c4 = shift;
  local_c0 = dst;
  local_b8 = src;
  tbb::detail::r1::initialize(&local_b0);
  local_d0.func = &local_100;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,embree::parallel_for_affinity<unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_1_>(unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_1_const&,tbb::detail::d1::affinity_partitioner&)::_lambda(unsigned_long)_1_,tbb::detail::d1::affinity_partitioner>
            (0,numTasks,1,&local_d0,(affinity_partitioner *)&local_118,&local_b0);
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
  if (cVar1 != '\0') {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"task cancelled");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_b0);
  last_00 = local_d8;
  local_b0.my_version = proxy_support;
  local_b0.my_traits = (context_traits)0x4;
  local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b0.my_name = CUSTOM_CTX;
  local_100.this = this;
  local_100.shift = &local_c4;
  local_100.src = &local_b8;
  local_100.dst = &local_c0;
  local_100.numTasks = &local_d8;
  tbb::detail::r1::initialize(&local_b0);
  local_d0.func = &local_100;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,embree::parallel_for_affinity<unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_2_>(unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_2_const&,tbb::detail::d1::affinity_partitioner&)::_lambda(unsigned_long)_1_,tbb::detail::d1::affinity_partitioner>
            (0,last_00,1,&local_d0,(affinity_partitioner *)&local_118,&local_b0);
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
  if (cVar1 == '\0') {
    tbb::detail::r1::destroy(&local_b0);
    tbb::detail::d1::affinity_partitioner_base::resize(&local_118,0);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"task cancelled");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void tbbRadixIteration(const Key shift, const bool last,
                           const Ty* __restrict src, Ty* __restrict dst,
                           const size_t numTasks)
    {
      affinity_partitioner ap;
      parallel_for_affinity(numTasks,[&] (size_t taskIndex) { tbbRadixIteration0(shift,src,dst,taskIndex,numTasks); },ap);
      parallel_for_affinity(numTasks,[&] (size_t taskIndex) { tbbRadixIteration1(shift,src,dst,taskIndex,numTasks); },ap);
    }